

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::sessionFIX40Fixture::createSession
          (sessionFIX40Fixture *this,int heartBtInt,int startDay,int endDay)

{
  string *beginString;
  Session *this_00;
  long *local_728;
  long local_720;
  long local_718 [2];
  long *local_708;
  long local_700;
  long local_6f8 [2];
  long *local_6e8;
  long local_6e0;
  long local_6d8 [2];
  ulong local_6c8;
  string local_6c0;
  undefined1 local_6a0 [16];
  string local_690;
  _Alloc_hider local_670;
  size_type local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  size_t local_650;
  int local_648;
  TimeRange sessionTime;
  string local_630;
  _Alloc_hider local_610;
  size_type local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  size_t local_5f0;
  int local_5e8;
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  if (this->object != (Session *)0x0) {
    (**(code **)(*(long *)this->object + 8))();
  }
  local_6e8 = local_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"FIX.4.0","");
  beginString = (string *)
                &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00325880;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::__cxx11::string::_M_construct<char*>
            ((string *)beginString,local_6e8,local_6e0 + (long)local_6e8);
  provider.m_applicationDictionaries._M_t._M_impl._0_8_ =
       &provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
       0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00326268;
  local_708 = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"TW","");
  _sessionTime = &PTR__FieldBase_00325880;
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_630,local_708,local_700 + (long)local_708);
  local_610._M_p = (pointer)&local_600;
  local_608 = 0;
  local_600._M_local_buf[0] = '\0';
  local_5f0 = 0;
  local_5e8 = 0;
  _sessionTime = &PTR__FieldBase_00325c20;
  local_728 = local_718;
  local_6c8 = (ulong)(uint)heartBtInt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"ISLD","");
  local_6a0._0_8_ = &PTR__FieldBase_00325880;
  local_6a0._8_4_ = 0x38;
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_690,local_728,local_720 + (long)local_728);
  local_670._M_p = (pointer)&local_660;
  local_668 = 0;
  local_660._M_local_buf[0] = '\0';
  local_650 = 0;
  local_648 = 0;
  local_6a0._0_8_ = &PTR__FieldBase_00326498;
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"");
  FIX::SessionID::SessionID(&sessionID,beginString,&local_630,&local_690,&local_6c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_6a0);
  if (local_728 != local_718) {
    operator_delete(local_728,local_718[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionTime);
  if (local_708 != local_6f8) {
    operator_delete(local_708,local_6f8[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  if (local_6e8 != local_6d8) {
    operator_delete(local_6e8,local_6d8[0] + 1);
  }
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             startDay,endDay);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  local_6a0._0_8_ = &local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a0,"../spec/FIX40.xml","");
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)local_6a0);
  if ((string *)local_6a0._0_8_ != &local_690) {
    operator_delete((void *)local_6a0._0_8_,(ulong)(local_690._M_dataplus._M_p + 1));
  }
  this_00 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (this_00,&(this->super_TestCallback).super_NullApplication.super_Application,
             (MessageStoreFactory *)&this->factory,&sessionID,&provider,&sessionTime,(int)local_6c8,
             (LogFactory *)0x0);
  this->object = this_00;
  FIX::Session::setResponder(this_00,(Responder *)this);
  FIX::DataDictionary::~DataDictionary(&provider.emptyDataDictionary);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree(&provider.m_applicationDictionaries._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
               *)&provider);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_frozenString._M_dataplus._M_p != &sessionID.m_frozenString.field_2) {
    operator_delete(sessionID.m_frozenString._M_dataplus._M_p,
                    sessionID.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_sessionQualifier._M_dataplus._M_p != &sessionID.m_sessionQualifier.field_2) {
    operator_delete(sessionID.m_sessionQualifier._M_dataplus._M_p,
                    sessionID.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID);
  return;
}

Assistant:

virtual void createSession( int heartBtInt, int startDay = -1 , int endDay = -1 )
  {
    if( object )
      delete object;

    SessionID sessionID( BeginString( "FIX.4.0" ),
                         SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
    TimeRange sessionTime( startTime, endTime, startDay, endDay );

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIX40.xml" );

    object = new Session( *this, factory, sessionID, provider,
                           sessionTime, heartBtInt, 0 );
    object->setResponder( this );
  }